

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::TestEventRepeater::~TestEventRepeater(TestEventRepeater *this)

{
  pointer ppTVar1;
  pointer ptr;
  
  (this->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_00253f18;
  ptr = (this->listeners_).
        super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
        ._M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ptr != ppTVar1) {
    do {
      if (*ptr != (TestEventListener *)0x0) {
        (*(*ptr)->_vptr_TestEventListener[1])();
      }
      ptr = ptr + 1;
    } while (ptr != ppTVar1);
    ptr = (this->listeners_).
          super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ptr != (pointer)0x0) {
    operator_delete(ptr,(long)(this->listeners_).
                              super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptr);
    return;
  }
  return;
}

Assistant:

TestEventRepeater::~TestEventRepeater() {
  ForEach(listeners_, Delete<TestEventListener>);
}